

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O1

void capnp::_::anon_unknown_0::doForwardingTest(bool allowForwarding,bool addReflectionLeg)

{
  Disposer DVar1;
  PromiseArena *pPVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  ArrayPtr<kj::String> argValues;
  ArrayPtr<kj::String> argValues_00;
  RequestHook *pRVar6;
  long *plVar7;
  size_t sVar8;
  undefined1 auVar9 [8];
  TestMoreStuffImpl *pTVar10;
  undefined8 uVar11;
  ClientHook *pCVar12;
  undefined4 uVar13;
  WeakFulfiller<capnp::Capability::Client> *params;
  TestVat *network;
  Vat *pVVar14;
  Entry *pEVar15;
  undefined8 *puVar16;
  StringPtr *pSVar17;
  StringPtr *pSVar18;
  void *__buf;
  nfds_t extraout_RDX;
  nfds_t extraout_RDX_00;
  nfds_t extraout_RDX_01;
  nfds_t extraout_RDX_02;
  nfds_t extraout_RDX_03;
  nfds_t extraout_RDX_04;
  nfds_t __nfds;
  void *__buf_00;
  char (*params_00) [79];
  char (*params_01) [80];
  PromiseNode *ptrCopy;
  long lVar19;
  undefined7 in_register_00000039;
  undefined1 unique;
  char *pcVar20;
  DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *in_R9;
  RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> RVar21;
  Own<capnp::ClientHook,_std::nullptr_t> OVar22;
  StringPtr to;
  StringPtr to_00;
  StringPtr to_01;
  StringPtr to_02;
  StringPtr name;
  StringPtr name_00;
  StringPtr key;
  StringPtr name_01;
  void *continuationTracePtr;
  Maybe<capnproto_test::capnp::test::TestMoreStuff::Client> holdBouncer;
  Client bobCap;
  Client daveCap;
  PromiseFulfillerPair<capnp::Capability::Client> paf;
  int eveHandleCount;
  int eveCallCount;
  int carolHandleCount;
  int carolCallCount;
  TestContext context;
  char *pcVar23;
  undefined *puVar24;
  undefined1 local_3d8 [12];
  undefined4 uStack_3cc;
  char *local_3c8 [2];
  undefined8 uStack_3b8;
  TestVat *pTStack_3b0;
  RequestHook *local_3a8;
  long *local_3a0;
  undefined1 local_390 [16];
  StringPtr local_380;
  StringPtr *local_370;
  bool local_368;
  undefined7 uStack_367;
  RequestHook *local_360;
  undefined1 local_358 [8];
  long *local_350 [2];
  undefined1 local_340 [8];
  TestMoreStuffImpl *local_338;
  long *local_330;
  undefined1 local_328 [32];
  StringPtr *pSStack_308;
  Disposer *local_300;
  Vat *local_2f0;
  Own<capnp::ClientHook,_std::nullptr_t> local_2e8;
  Vat *local_2d8;
  Own<capnp::_::TestMoreStuffImpl,_std::nullptr_t> local_2d0;
  undefined4 local_2bc;
  int local_2b8 [2];
  Vat *local_2b0;
  Vat *local_2a8;
  int local_2a0 [2];
  char *local_298;
  undefined *puStack_290;
  undefined8 local_288;
  char *local_280;
  undefined *puStack_278;
  undefined8 local_270;
  StringPtr local_268;
  Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_> local_258 [6];
  undefined8 *local_228;
  long *local_220;
  Maybe<capnp::MessageSize> local_218;
  Maybe<capnp::MessageSize> local_200;
  TestContext local_1e8;
  
  TestContext::TestContext(&local_1e8);
  local_2b0 = local_1e8.alice;
  local_2d8 = local_1e8.bob;
  local_2a0[1] = 0;
  local_2a0[0] = 0;
  local_1e8.network.forwardingEnabled = allowForwarding;
  kj::heap<capnp::_::TestMoreStuffImpl,int&,int&>((kj *)&local_2d0,local_2a0 + 1,local_2a0);
  name.content.size_ = 6;
  name.content.ptr = "carol";
  local_2a8 = _::(anonymous_namespace)::TestContext::
              initVat<kj::Own<capnp::_::TestMoreStuffImpl,decltype(nullptr)>>
                        ((TestContext *)&local_1e8,name,&local_2d0);
  pTVar10 = local_2d0.ptr;
  if (local_2d0.ptr != (TestMoreStuffImpl *)0x0) {
    local_2d0.ptr = (TestMoreStuffImpl *)0x0;
    (**(local_2d0.disposer)->_vptr_Disposer)
              (local_2d0.disposer,
               &(pTVar10->super_Server).field_0x0 +
               *(long *)(*(long *)&pTVar10->super_Server + -0x10));
  }
  local_2bc = (undefined4)CONCAT71(in_register_00000039,allowForwarding);
  local_2b8[1] = 0;
  local_2b8[0] = 0;
  params = (WeakFulfiller<capnp::Capability::Client> *)operator_new(0x18);
  (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (params->super_PromiseFulfiller<capnp::Capability::Client>).super_PromiseRejector.
  _vptr_PromiseRejector = (_func_int **)&PTR_reject_006e76b8;
  (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_006e76f0;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<capnp::Capability::Client,kj::_::PromiseAndFulfillerAdapter<capnp::Capability::Client>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<capnp::Capability::Client>&>
            ((PromiseDisposer *)local_3d8,params);
  local_328._0_8_ = (SegmentBuilder *)0x0;
  name_00.content.size_ = 5;
  name_00.content.ptr = "dave";
  local_328._8_8_ = &params->super_WeakFulfillerBase;
  local_328._16_8_ = params;
  network = TestNetwork::add(&local_1e8.network,name_00);
  pVVar14 = (Vat *)operator_new(0x18);
  local_340 = (undefined1  [8])local_3d8._0_8_;
  pVVar14->vatNetwork = network;
  local_3d8._0_8_ =
       kj::_::
       SimpleTransformPromiseNode<capnp::Capability::Client,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.h:1128:47)>
       ::anon_class_1_0_00000001_for_func::operator();
  kj::_::PromiseDisposer::
  appendPromise<kj::_::SimpleTransformPromiseNode<capnp::Capability::Client,capnp::Capability::Client::Client<capnp::Capability::Client,void>(kj::Promise<capnp::Capability::Client>&&)::_lambda(capnp::Capability::Client&&)_1_>,kj::_::PromiseDisposer,capnp::Capability::Client::Client<capnp::Capability::Client,void>(kj::Promise<capnp::Capability::Client>&&)::_lambda(capnp::Capability::Client&&)_1_,void*&>
            ((PromiseDisposer *)local_390,(OwnPromiseNode *)local_340,
             (anon_class_1_0_00000001_for_func *)&local_2e8,(void **)local_3d8);
  local_358 = (undefined1  [8])local_390._0_8_;
  newLocalPromiseClient
            ((capnp *)local_3d8,(Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)local_358);
  auVar9 = local_358;
  if (local_358 != (undefined1  [8])0x0) {
    local_358 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar9);
  }
  RVar21 = makeRpcServer<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestThirdPartyCompletion,capnproto_test::capnp::test::TestThirdPartyToAwait,capnproto_test::capnp::test::TestThirdPartyToContact,capnproto_test::capnp::test::TestJoinResult>
                     ((capnp *)&pVVar14->rpcSystem,&network->super_TestVatBase,(Client *)local_3d8);
  uVar3 = stack0xfffffffffffffc30;
  if ((Vat *)stack0xfffffffffffffc30 != (Vat *)0x0) {
    stack0xfffffffffffffc30 = (Vat *)0x0;
    (*(code *)((SegmentReader *)local_3d8._0_8_)->arena->_vptr_Arena)
              (local_3d8._0_8_,uVar3 + *(long *)(*(long *)uVar3 + -0x10),
               RVar21.super_RpcSystemBase.impl.ptr);
  }
  auVar9 = local_340;
  local_3d8._0_8_ =
       &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestContext::Vat>::instance;
  unique0x100015ce = pVVar14;
  if (local_340 != (undefined1  [8])0x0) {
    local_340 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar9);
  }
  key.content.size_ = 5;
  key.content.ptr = "dave";
  pEVar15 = kj::
            HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t>_>
            ::insert(&local_1e8.vats,key,
                     (Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t> *)
                     local_3d8);
  local_2f0 = (pEVar15->value).ptr;
  if ((Vat *)stack0xfffffffffffffc30 != (Vat *)0x0) {
    stack0xfffffffffffffc30 = (Vat *)0x0;
    (*(code *)((SegmentReader *)local_3d8._0_8_)->arena->_vptr_Arena)();
  }
  local_390._0_8_ = local_390._0_8_ & 0xffffffffffffff00;
  if (addReflectionLeg) {
    kj::heap<capnp::_::TestMoreStuffImpl,int&,int&>((kj *)local_340,local_2b8 + 1,local_2b8);
    name_01.content.size_ = 4;
    name_01.content.ptr = "eve";
    _::(anonymous_namespace)::TestContext::
    initVat<kj::Own<capnp::_::TestMoreStuffImpl,decltype(nullptr)>>
              ((TestContext *)&local_1e8,name_01,
               (Own<capnp::_::TestMoreStuffImpl,_std::nullptr_t> *)local_340);
    pTVar10 = local_338;
    if (local_338 != (TestMoreStuffImpl *)0x0) {
      local_338 = (TestMoreStuffImpl *)0x0;
      (**((PromiseArenaMember *)local_340)->_vptr_PromiseArenaMember)
                (local_340,
                 &(pTVar10->super_Server).field_0x0 +
                 *(long *)(*(long *)&pTVar10->super_Server + -0x10));
    }
    to.content.size_ = 4;
    to.content.ptr = "eve";
    TestContext::Vat::connect<capnproto_test::capnp::test::TestMoreStuff>
              ((Client *)local_3d8,local_2f0,to,false);
    sVar8 = local_380.content.size_;
    if (local_390[0] == (PromiseDisposer)0x1) {
      local_390._0_8_ = local_390._0_8_ & 0xffffffffffffff00;
      if ((long *)local_380.content.size_ != (long *)0x0) {
        local_380.content.size_ = 0;
        (*(code *)**(undefined8 **)local_380.content.ptr)
                  (local_380.content.ptr,sVar8 + *(long *)(*(long *)sVar8 + -0x10));
      }
    }
    DVar1._vptr_Disposer = *(_func_int ***)(local_3d8._0_8_ + -0x18);
    local_380.content.ptr =
         (char *)CONCAT44(*(undefined4 *)(local_3d8 + 4 + (long)DVar1._vptr_Disposer),
                          *(undefined4 *)(local_3d8 + (long)DVar1._vptr_Disposer));
    local_380.content.size_ =
         CONCAT44(*(undefined4 *)((long)&uStack_3cc + (long)DVar1._vptr_Disposer),
                  *(undefined4 *)(local_3d8 + 8 + (long)DVar1._vptr_Disposer));
    *(undefined8 *)(local_3d8 + 8 + (long)DVar1._vptr_Disposer) = 0;
    pcVar20 = local_3c8[0];
    local_390._8_8_ = &capnproto_test::capnp::test::TestMoreStuff::Client::typeinfo;
    local_390[0] = (PromiseDisposer)0x1;
    if ((long *)local_3c8[0] != (long *)0x0) {
      local_3c8[0] = (char *)0x0;
      (*(code *)**(undefined8 **)stack0xfffffffffffffc30)
                (stack0xfffffffffffffc30,(long)pcVar20 + *(long *)(*(long *)pcVar20 + -0x10));
    }
  }
  uVar11 = local_328._16_8_;
  unique = 0;
  to_00.content.size_ = 6;
  to_00.content.ptr = "carol";
  TestContext::Vat::connect<capnproto_test::capnp::test::TestMoreStuff>
            ((Client *)local_358,local_2f0,to_00,false);
  puVar16 = (undefined8 *)operator_new(0x50);
  pPVar2 = ((PromiseArenaMember *)((long)local_358 + -0x20))->arena;
  uVar3 = *(undefined8 *)(local_358 + (long)pPVar2);
  uVar4 = *(undefined8 *)((long)local_350 + (long)pPVar2);
  *(undefined8 *)((long)local_350 + (long)pPVar2) = 0;
  kj::Maybe<capnproto_test::capnp::test::TestMoreStuff::Client>::Maybe
            ((Maybe<capnproto_test::capnp::test::TestMoreStuff::Client> *)local_3d8,
             (Maybe<capnproto_test::capnp::test::TestMoreStuff::Client> *)local_390);
  puVar16[9] = 0;
  *puVar16 = 0x6e61c8;
  puVar16[8] = 0x6e6288;
  puVar16[2] = uVar3;
  puVar16[3] = uVar4;
  puVar16[1] = &capnproto_test::capnp::test::TestMoreStuff::Client::typeinfo;
  kj::Maybe<capnproto_test::capnp::test::TestMoreStuff::Client>::Maybe
            ((Maybe<capnproto_test::capnp::test::TestMoreStuff::Client> *)(puVar16 + 4),
             (Maybe<capnproto_test::capnp::test::TestMoreStuff::Client> *)local_3d8);
  pcVar20 = local_3c8[1];
  if ((local_3d8[0] == (PromiseDisposer)0x1) && ((TestVat *)local_3c8[1] != (TestVat *)0x0)) {
    local_3c8[1] = (char *)0x0;
    (*(code *)**(undefined8 **)local_3c8[0])
              (local_3c8[0],(long)pcVar20 + *(long *)(*(long *)pcVar20 + -0x10));
  }
  register0x000000a0 = puVar16 + 8;
  local_3d8._0_8_ =
       &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestNoTailForwarder>::instance;
  OVar22 = Capability::Client::makeLocalClient
                     ((Client *)&local_2e8,
                      (Own<capnp::Capability::Server,_std::nullptr_t> *)local_3d8);
  uVar3 = stack0xfffffffffffffc30;
  if ((Vat *)stack0xfffffffffffffc30 != (Vat *)0x0) {
    stack0xfffffffffffffc30 = (Vat *)0x0;
    (*(code *)**(undefined8 **)local_3d8._0_8_)
              (local_3d8._0_8_,uVar3 + *(long *)(*(long *)uVar3 + -0x10),OVar22.ptr);
  }
  (*(((PromiseFulfiller<capnp::Capability::Client> *)uVar11)->super_PromiseRejector).
    _vptr_PromiseRejector[2])(uVar11,&local_2e8);
  pCVar12 = local_2e8.ptr;
  if (local_2e8.ptr != (ClientHook *)0x0) {
    local_2e8.ptr = (ClientHook *)0x0;
    (**(local_2e8.disposer)->_vptr_Disposer)
              (local_2e8.disposer,
               (_func_int *)((long)&pCVar12->_vptr_ClientHook + (long)pCVar12->_vptr_ClientHook[-2])
              );
  }
  plVar7 = local_350[1];
  if (local_350[1] != (long *)0x0) {
    local_350[1] = (long *)0x0;
    (**(code **)*local_350[0])(local_350[0],(long)plVar7 + *(long *)(*plVar7 + -0x10));
  }
  sVar8 = local_380.content.size_;
  if ((local_390[0] == (PromiseDisposer)0x1) && ((long *)local_380.content.size_ != (long *)0x0)) {
    local_380.content.size_ = 0;
    (*(code *)**(undefined8 **)local_380.content.ptr)
              (local_380.content.ptr,sVar8 + *(long *)(*(long *)sVar8 + -0x10));
  }
  uVar3 = local_328._16_8_;
  if ((WeakFulfiller<capnp::Capability::Client> *)local_328._16_8_ !=
      (WeakFulfiller<capnp::Capability::Client> *)0x0) {
    local_328._16_8_ = (WeakFulfiller<capnp::Capability::Client> *)0x0;
    (**((Disposer *)local_328._8_8_)->_vptr_Disposer)
              (local_328._8_8_,
               (((PromiseFulfiller<capnp::Capability::Client> *)uVar3)->super_PromiseRejector).
               _vptr_PromiseRejector[-2] +
               (long)&(((PromiseFulfiller<capnp::Capability::Client> *)uVar3)->super_PromiseRejector
                      )._vptr_PromiseRejector);
  }
  uVar3 = local_328._0_8_;
  if ((SegmentBuilder *)local_328._0_8_ != (SegmentBuilder *)0x0) {
    local_328._0_8_ = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
  }
  to_01.content.size_ = 4;
  to_01.content.ptr = "bob";
  TestContext::Vat::connect<capnproto_test::capnp::test::TestInterface>
            ((Client *)local_358,local_1e8.alice,to_01,(bool)unique);
  pcVar20 = (char *)0x0;
  to_02.content.size_ = 5;
  to_02.content.ptr = "dave";
  pSVar17 = (StringPtr *)&DAT_00000005;
  TestContext::Vat::connect<capnproto_test::capnp::test::TestMoreStuff>
            ((Client *)local_340,local_1e8.alice,to_02,false);
  pVVar14 = local_2a8;
  local_200.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::holdRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
              *)local_3d8,(Client *)local_340,&local_200);
  local_390._0_8_ = local_3d8._0_8_;
  local_390._8_8_ = stack0xfffffffffffffc30;
  local_380.content.ptr = local_3c8[1];
  PointerBuilder::setCapability
            ((PointerBuilder *)local_390,
             (Own<capnp::ClientHook,_std::nullptr_t> *)
             ((*(PromiseArena **)((long)local_358 + -0x18))->bytes +
             (long)&((Client *)local_358)->_vptr_Client));
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
          *)local_390,(int)local_3d8,__buf,(size_t)pSVar17,(int)pcVar20);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
  ;
  puStack_278 = &DAT_0052e440;
  local_270 = 0x500000895;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>::wait
            (local_258,local_390);
  plVar7 = local_220;
  __nfds = extraout_RDX;
  if (local_220 != (long *)0x0) {
    local_220 = (long *)0x0;
    (**(code **)*local_228)(local_228,(long)plVar7 + *(long *)(*plVar7 + -0x10));
    __nfds = extraout_RDX_00;
  }
  pSVar18 = local_370;
  sVar8 = local_380.content.size_;
  if ((long *)local_380.content.size_ != (long *)0x0) {
    local_380.content.size_ = 0;
    local_370 = (StringPtr *)0x0;
    in_R9 = (DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *)0x0;
    pcVar20 = (char *)pSVar18;
    (*(code *)**(undefined8 **)CONCAT71(uStack_367,local_368))
              ((undefined8 *)CONCAT71(uStack_367,local_368),sVar8,8);
    pSVar17 = pSVar18;
    __nfds = extraout_RDX_01;
  }
  pcVar23 = local_380.content.ptr;
  if ((TestVat *)local_380.content.ptr != (TestVat *)0x0) {
    local_380.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_390._8_8_)
              (local_390._8_8_,(long)pcVar23 + *(long *)(*(long *)pcVar23 + -0x10));
    __nfds = extraout_RDX_02;
  }
  uVar3 = local_390._0_8_;
  if ((SegmentBuilder *)local_390._0_8_ != (SegmentBuilder *)0x0) {
    local_390._0_8_ = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
    __nfds = extraout_RDX_03;
  }
  pRVar6 = local_3a8;
  if (local_3a8 != (RequestHook *)0x0) {
    local_3a8 = (RequestHook *)0x0;
    (**(pTStack_3b0->super_TestVatBase).super_VatNetworkBase._vptr_VatNetworkBase)
              (pTStack_3b0,
               (_func_int *)((long)&pRVar6->_vptr_RequestHook + (long)pRVar6->_vptr_RequestHook[-2])
              );
    __nfds = extraout_RDX_04;
  }
  kj::WaitScope::poll(&local_1e8.waitScope,(pollfd *)0xffffffff,__nfds,(int)pSVar17);
  local_218.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::callHeldRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
              *)local_390,(Client *)local_340,&local_218);
  Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
          *)local_328,(int)local_390,__buf_00,(size_t)pSVar17,(int)pcVar20);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
  ;
  puStack_290 = &DAT_0052e440;
  local_288 = 0x110000089e;
  pcVar23 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
  ;
  puVar24 = &DAT_0052e440;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>
              *)local_3d8,local_328);
  pSVar17 = pSStack_308;
  uVar3 = local_328._24_8_;
  if ((WirePointer *)local_328._24_8_ != (WirePointer *)0x0) {
    local_328._24_8_ = (WirePointer *)0x0;
    pSStack_308 = (StringPtr *)0x0;
    in_R9 = (DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *)0x0;
    (**local_300->_vptr_Disposer)(local_300,uVar3,8);
    pcVar20 = (char *)pSVar17;
  }
  uVar3 = local_328._16_8_;
  if ((WeakFulfiller<capnp::Capability::Client> *)local_328._16_8_ !=
      (WeakFulfiller<capnp::Capability::Client> *)0x0) {
    local_328._16_8_ = (WeakFulfiller<capnp::Capability::Client> *)0x0;
    (**((Disposer *)local_328._8_8_)->_vptr_Disposer)
              (local_328._8_8_,
               (((PromiseFulfiller<capnp::Capability::Client> *)uVar3)->super_PromiseRejector).
               _vptr_PromiseRejector[-2] +
               (long)&(((PromiseFulfiller<capnp::Capability::Client> *)uVar3)->super_PromiseRejector
                      )._vptr_PromiseRejector);
  }
  uVar3 = local_328._0_8_;
  if ((SegmentBuilder *)local_328._0_8_ != (SegmentBuilder *)0x0) {
    local_328._0_8_ = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
  }
  if (local_360 != (RequestHook *)0x0) {
    local_360 = (RequestHook *)0x0;
    (*(code *)**(undefined8 **)CONCAT71(uStack_367,local_368))();
  }
  if (uStack_3b8._4_2_ == 0) {
    uVar13 = 0x7fffffff;
    local_328._8_8_ = (Vat *)0x0;
    local_328._16_8_ = (TestVat *)0x0;
    local_328._0_8_ = (SegmentBuilder *)0x0;
  }
  else {
    local_328._8_8_ = stack0xfffffffffffffc30;
    local_328._16_8_ = local_3c8[1];
    local_328._0_8_ = local_3d8._0_8_;
    uVar13 = pTStack_3b0._0_4_;
  }
  local_328._24_4_ = uVar13;
  local_2e8 = (Own<capnp::ClientHook,_std::nullptr_t>)
              PointerReader::getBlob<capnp::Text>((PointerReader *)local_328,(void *)0x0,0);
  kj::_::DebugExpression<capnp::Text::Reader>::operator==
            ((DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *)local_390,
             (DebugExpression<capnp::Text::Reader> *)&local_2e8,(char (*) [4])0x53814d);
  if ((local_368 == false) && (kj::_::Debug::minSeverity < 3)) {
    pcVar20 = "failed: expected resp.getS() == \"bar\"";
    in_R9 = (DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *)local_390;
    kj::_::Debug::
    log<char_const(&)[38],kj::_::DebugComparison<capnp::Text::Reader,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x89f,ERROR,"\"failed: expected \" \"resp.getS() == \\\"bar\\\"\", _kjCondition",
               (char (*) [38])"failed: expected resp.getS() == \"bar\"",in_R9);
  }
  plVar7 = local_3a0;
  if (local_3a0 != (long *)0x0) {
    local_3a0 = (long *)0x0;
    (**local_3a8->_vptr_RequestHook)(local_3a8,(long)plVar7 + *(long *)(*plVar7 + -0x10));
  }
  local_328._0_8_ = pVVar14->vatNetwork;
  kj::
  HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
  ::find<capnp::_::(anonymous_namespace)::TestVat*>
            ((HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
              *)local_3d8,(TestVat **)&local_2f0->vatNetwork->connections);
  if ((SegmentBuilder *)local_3d8._0_8_ == (SegmentBuilder *)0x0) {
    local_390._0_8_ = (SegmentBuilder *)0x0;
  }
  else {
    local_390._0_8_ = ((SegmentReader *)local_3d8._0_8_)->arena;
  }
  local_390._8_8_ = &kj::none;
  local_380.content.ptr = " != ";
  local_380.content.size_ = 5;
  local_370 = (StringPtr *)
              CONCAT71(local_370._1_7_,(SegmentBuilder *)local_390._0_8_ != (SegmentBuilder *)0x0);
  if (((SegmentBuilder *)local_390._0_8_ == (SegmentBuilder *)0x0) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::str<char_const(&)[79]>
              ((String *)local_3d8,
               (kj *)
               "failed: expected dave.vatNetwork.getConnectionTo(carol.vatNetwork) != kj::none",
               params_00);
    local_2e8.ptr = (ClientHook *)0x12;
    local_2e8.disposer = (Disposer *)"(can\'t stringify)";
    local_268.content.ptr = "(can\'t stringify)";
    local_268.content.size_ = 0x12;
    kj::_::concat<kj::StringPtr,kj::StringPtr&,kj::StringPtr>
              ((String *)local_328,(_ *)&local_2e8,&local_380,&local_268,(StringPtr *)pcVar20);
    pcVar20 = local_3d8;
    local_3c8[1] = (char *)local_328._0_8_;
    uStack_3b8 = (Vat *)local_328._8_8_;
    pTStack_3b0 = (TestVat *)local_328._16_8_;
    in_R9 = (DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *)0x2;
    argValues.size_ = (size_t)puVar24;
    argValues.ptr = (String *)pcVar23;
    kj::_::Debug::logInternal
              ((Debug *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,(char *)0x8a3,2,0x52e451,pcVar20,argValues);
    lVar19 = 0x18;
    do {
      lVar5 = *(long *)(local_3d8 + lVar19);
      if (lVar5 != 0) {
        pcVar20 = *(char **)(local_3d8 + lVar19 + 8);
        *(undefined8 *)(local_3d8 + lVar19) = 0;
        *(undefined8 *)(local_3d8 + lVar19 + 8) = 0;
        in_R9 = (DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *)0x0;
        (**(code **)**(undefined8 **)((long)local_3c8 + lVar19))
                  (*(undefined8 **)((long)local_3c8 + lVar19),lVar5,1);
      }
      lVar19 = lVar19 + -0x18;
    } while (lVar19 != -0x18);
  }
  local_328._0_8_ = local_2d8->vatNetwork;
  kj::
  HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
  ::find<capnp::_::(anonymous_namespace)::TestVat*>
            ((HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
              *)local_390,(TestVat **)&pVVar14->vatNetwork->connections);
  if ((SegmentBuilder *)local_390._0_8_ == (SegmentBuilder *)0x0) {
    local_3d8._0_8_ = (SegmentBuilder *)0x0;
  }
  else {
    local_3d8._0_8_ = ((SegmentReader *)local_390._0_8_)->arena;
  }
  stack0xfffffffffffffc30 = &kj::none;
  local_3c8[0] = " != ";
  local_3c8[1] = (char *)0x5;
  uStack_3b8 = (Vat *)CONCAT71(uStack_3b8._1_7_,
                               (SegmentBuilder *)local_3d8._0_8_ != (SegmentBuilder *)0x0);
  if (((SegmentBuilder *)local_3d8._0_8_ == (SegmentBuilder *)0x0) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[78],kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>,kj::None_const&>&>
              ((char *)0x8a4,0x52e502,0x52e563,local_3d8,(char (*) [78])pcVar20,
               (DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
                *)in_R9);
  }
  local_328._0_8_ = local_2b0->vatNetwork;
  kj::
  HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
  ::find<capnp::_::(anonymous_namespace)::TestVat*>
            ((HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
              *)local_3d8,(TestVat **)&pVVar14->vatNetwork->connections);
  if ((SegmentBuilder *)local_3d8._0_8_ == (SegmentBuilder *)0x0) {
    local_390._0_8_ = (SegmentBuilder *)0x0;
  }
  else {
    local_390._0_8_ = ((SegmentReader *)local_3d8._0_8_)->arena;
  }
  local_390._8_8_ = &kj::none;
  local_380.content.ptr = " == ";
  local_380.content.size_ = 5;
  local_370 = (StringPtr *)
              CONCAT71(local_370._1_7_,(SegmentBuilder *)local_390._0_8_ == (SegmentBuilder *)0x0);
  if (((SegmentBuilder *)local_390._0_8_ != (SegmentBuilder *)0x0) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::str<char_const(&)[80]>
              ((String *)local_3d8,
               (kj *)
               "failed: expected carol.vatNetwork.getConnectionTo(alice.vatNetwork) == kj::none",
               params_01);
    local_2e8.ptr = (ClientHook *)0x12;
    local_2e8.disposer = (Disposer *)"(can\'t stringify)";
    local_268.content.ptr = "(can\'t stringify)";
    local_268.content.size_ = 0x12;
    kj::_::concat<kj::StringPtr,kj::StringPtr&,kj::StringPtr>
              ((String *)local_328,(_ *)&local_2e8,&local_380,&local_268,(StringPtr *)pcVar20);
    pcVar20 = local_3d8;
    local_3c8[1] = (char *)local_328._0_8_;
    uStack_3b8 = (Vat *)local_328._8_8_;
    pTStack_3b0 = (TestVat *)local_328._16_8_;
    in_R9 = (DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *)0x2;
    argValues_00.size_ = (size_t)puVar24;
    argValues_00.ptr = (String *)pcVar23;
    kj::_::Debug::logInternal
              ((Debug *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,(char *)0x8a7,2,0x52e5b1,pcVar20,argValues_00);
    lVar19 = 0x18;
    do {
      lVar5 = *(long *)(local_3d8 + lVar19);
      if (lVar5 != 0) {
        pcVar20 = *(char **)(local_3d8 + lVar19 + 8);
        *(undefined8 *)(local_3d8 + lVar19) = 0;
        *(undefined8 *)(local_3d8 + lVar19 + 8) = 0;
        in_R9 = (DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *)0x0;
        (**(code **)**(undefined8 **)((long)local_3c8 + lVar19))
                  (*(undefined8 **)((long)local_3c8 + lVar19),lVar5,1);
      }
      lVar19 = lVar19 + -0x18;
    } while (lVar19 != -0x18);
  }
  if ((char)local_2bc == '\0') {
    local_328._0_8_ = local_2d8->vatNetwork;
    kj::
    HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
    ::find<capnp::_::(anonymous_namespace)::TestVat*>
              ((HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
                *)local_390,(TestVat **)&local_2f0->vatNetwork->connections);
    if ((SegmentBuilder *)local_390._0_8_ == (SegmentBuilder *)0x0) {
      local_3d8._0_8_ = (SegmentBuilder *)0x0;
    }
    else {
      local_3d8._0_8_ = ((SegmentReader *)local_390._0_8_)->arena;
    }
    stack0xfffffffffffffc30 = &kj::none;
    local_3c8[0] = " != ";
    local_3c8[1] = (char *)0x5;
    if (((PromiseNode *)local_3d8._0_8_ == (PromiseNode *)0x0) && (kj::_::Debug::minSeverity < 3)) {
      uStack_3b8._0_1_ = (PromiseNode *)local_3d8._0_8_ != (PromiseNode *)0x0;
      kj::_::Debug::
      log<char_const(&)[77],kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>,kj::None_const&>&>
                ((char *)0x8b2,0x52e711,0x52e771,local_3d8,(char (*) [77])pcVar20,
                 (DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
                  *)in_R9);
    }
    local_3d8._0_8_ = &local_1e8.network.forwardCount;
    uStack_3b8._0_1_ = local_1e8.network.forwardCount == 0;
    stack0xfffffffffffffc30 = stack0xfffffffffffffc30 & 0xffffffff00000000;
    local_3c8[0] = " == ";
    local_3c8[1] = (char *)0x5;
    if ((!uStack_3b8._0_1_) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x8b5,ERROR,
                 "\"failed: expected \" \"context.network.forwardCount == 0\", _kjCondition",
                 (char (*) [51])"failed: expected context.network.forwardCount == 0",
                 (DebugComparison<unsigned_int_&,_int> *)local_3d8);
    }
    local_3d8._0_8_ = &local_1e8.network.deniedForwardCount;
    local_3d8._8_4_ = 1;
    local_3c8[0] = " == ";
    local_3c8[1] = (char *)0x5;
    uStack_3b8._0_1_ = local_1e8.network.deniedForwardCount == 1;
    if ((local_1e8.network.deniedForwardCount != 1) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x8b6,ERROR,
                 "\"failed: expected \" \"context.network.deniedForwardCount == 1\", _kjCondition",
                 (char (*) [57])"failed: expected context.network.deniedForwardCount == 1",
                 (DebugComparison<unsigned_int_&,_int> *)local_3d8);
    }
  }
  else {
    local_328._0_8_ = local_2d8->vatNetwork;
    kj::
    HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
    ::find<capnp::_::(anonymous_namespace)::TestVat*>
              ((HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
                *)local_390,(TestVat **)&local_2f0->vatNetwork->connections);
    if ((SegmentBuilder *)local_390._0_8_ == (SegmentBuilder *)0x0) {
      local_3d8._0_8_ = (SegmentBuilder *)0x0;
    }
    else {
      local_3d8._0_8_ = ((SegmentReader *)local_390._0_8_)->arena;
    }
    stack0xfffffffffffffc30 = &kj::none;
    local_3c8[0] = " == ";
    local_3c8[1] = (char *)0x5;
    if (((PromiseNode *)local_3d8._0_8_ != (PromiseNode *)0x0) && (kj::_::Debug::minSeverity < 3)) {
      uStack_3b8._0_1_ = (PromiseNode *)local_3d8._0_8_ == (PromiseNode *)0x0;
      kj::_::Debug::
      log<char_const(&)[77],kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>,kj::None_const&>&>
                ((char *)0x8ab,0x52e664,0x52e6c4,local_3d8,(char (*) [77])pcVar20,
                 (DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
                  *)in_R9);
    }
    local_3d8._0_8_ = &local_1e8.network.deniedForwardCount;
    stack0xfffffffffffffc30 = stack0xfffffffffffffc30 & 0xffffffff00000000;
    local_3c8[0] = " == ";
    local_3c8[1] = (char *)0x5;
    uStack_3b8._0_1_ = local_1e8.network.deniedForwardCount == 0;
    if ((local_1e8.network.deniedForwardCount != 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x8af,ERROR,
                 "\"failed: expected \" \"context.network.deniedForwardCount == 0\", _kjCondition",
                 (char (*) [57])"failed: expected context.network.deniedForwardCount == 0",
                 (DebugComparison<unsigned_int_&,_int> *)local_3d8);
    }
  }
  plVar7 = local_330;
  if (local_330 != (long *)0x0) {
    local_330 = (long *)0x0;
    (*(code *)**(undefined8 **)&local_338->super_Server)
              (local_338,(long)plVar7 + *(long *)(*plVar7 + -0x10));
  }
  plVar7 = local_350[1];
  if (local_350[1] != (long *)0x0) {
    local_350[1] = (long *)0x0;
    (**(code **)*local_350[0])(local_350[0],(long)plVar7 + *(long *)(*plVar7 + -0x10));
  }
  TestContext::~TestContext(&local_1e8);
  return;
}

Assistant:

void doForwardingTest(bool allowForwarding, bool addReflectionLeg) {
  TestContext context;
  context.network.forwardingEnabled = allowForwarding;

  // Set up Alice, Bob, Carol, and Dave.
  auto& alice = context.alice;
  auto& bob = context.bob;

  int carolCallCount = 0;
  int carolHandleCount = 0;
  auto& carol = context.initVat("carol",
      kj::heap<TestMoreStuffImpl>(carolCallCount, carolHandleCount));

  int eveCallCount = 0;
  int eveHandleCount = 0;

  // Arrange for Dave to forward all calls to Carol.
  auto& dave = [&]() -> TestContext::Vat& {
    auto paf = kj::newPromiseAndFulfiller<Capability::Client>();
    auto& dave = context.initVat("dave", kj::mv(paf.promise));

    kj::Maybe<test::TestMoreStuff::Client> holdBouncer = kj::none;
    if (addReflectionLeg) {
      // Add a `holdBouncer`, so the capability gets bounced from Dave to Eve and back to Dave
      // again before forwarding on to Carol.
      context.initVat("eve", kj::heap<TestMoreStuffImpl>(eveCallCount, eveHandleCount));
      holdBouncer = dave.connect<test::TestMoreStuff>("eve");
    }

    paf.fulfiller->fulfill(kj::heap<TestNoTailForwarder>(
        dave.connect<test::TestMoreStuff>("carol"), kj::mv(holdBouncer)));
    return dave;
  }();

  // Alice connects to Bob and Dave.
  auto bobCap = context.alice.connect<test::TestInterface>("bob");
  auto daveCap = context.alice.connect<test::TestMoreStuff>("dave");

  // Send `bobCap` to Dave, who sends it on to Carol.
  {
    auto req = daveCap.holdRequest();
    req.setCap(kj::mv(bobCap));
    req.send().wait(context.waitScope);
  }

  // Pump event loop to allow things to settle.
  context.waitScope.poll();

  // Tell Dave to invoke the held capability. Dave forwards to Carol. This forces Carol to connect
  // to Bob.
  {
    auto resp = daveCap.callHeldRequest().send().wait(context.waitScope);
    KJ_EXPECT(resp.getS() == "bar");
  }

  // Dave is connected to Carol, who is connected to Bob.
  KJ_EXPECT(dave.vatNetwork.getConnectionTo(carol.vatNetwork) != kj::none);
  KJ_EXPECT(carol.vatNetwork.getConnectionTo(bob.vatNetwork) != kj::none);

  // Carol never connected to Alice.
  KJ_EXPECT(carol.vatNetwork.getConnectionTo(alice.vatNetwork) == kj::none);

  if (allowForwarding) {
    // Dave never connected to Bob.
    KJ_EXPECT(dave.vatNetwork.getConnectionTo(bob.vatNetwork) == kj::none);

    // Forwarding occurred.
    KJ_EXPECT(context.network.forwardCount == addReflectionLeg ? 3 : 1);
    KJ_EXPECT(context.network.deniedForwardCount == 0);
  } else {
    // Dave had to accept the capability from Bob before forwarding it, so had to connect to bob.
    KJ_EXPECT(dave.vatNetwork.getConnectionTo(bob.vatNetwork) != kj::none);

    // No forwarding occurred.
    KJ_EXPECT(context.network.forwardCount == 0);
    KJ_EXPECT(context.network.deniedForwardCount == 1);
  }
}